

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O0

void labpack_write_object_bytes(labpack_writer_t *writer,char *data,size_t size)

{
  _Bool _Var1;
  size_t size_local;
  char *data_local;
  labpack_writer_t *writer_local;
  
  if (writer == (labpack_writer_t *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                  ,0x161,"void labpack_write_object_bytes(labpack_writer_t *, const char *, size_t)"
                 );
  }
  _Var1 = labpack_writer_is_ok(writer);
  if (_Var1) {
    if ((data == (char *)0x0) && (size != 0)) {
      writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
      writer->status_message = "The MessagePack object data is NULL but the size is not zero";
    }
    else {
      mpack_write_object_bytes(writer->encoder,data,size);
      labpack_writer_check_encoder(writer);
    }
  }
  return;
}

Assistant:

void
labpack_write_object_bytes(labpack_writer_t* writer, const char* data, size_t size)
{
    assert(writer);
    if (labpack_writer_is_ok(writer)) {
        if (!data && size > 0) {
            writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
            writer->status_message = "The MessagePack object data is NULL but the size is not zero";
            return;
        }
        mpack_write_object_bytes(writer->encoder, data, size);
        labpack_writer_check_encoder(writer);
    }
}